

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.cpp
# Opt level: O2

void __thiscall Link::Link(Link *this,char *name)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,name,&local_31);
  MetaSim::Entity::Entity(&this->super_Entity,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR__Link_0012b528;
  return;
}

Assistant:

Link::Link(const char *name) : Entity(name)
{
}